

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicy.cpp
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
pgi::JointPolicy::joint_vertices(JointPolicy *this)

{
  bool bVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  pair<const_unsigned_long,_unsigned_int> *mit;
  const_iterator __end1;
  const_iterator __begin1;
  nm_type *__range1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *v;
  map<unsigned_long,_unsigned_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
  *in_stack_ffffffffffffff98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  _Self local_30;
  _Self local_28;
  pointer *local_20;
  undefined1 local_11;
  
  local_11 = 0;
  __x = in_RDI;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2f9fcf);
  local_20 = &in_RSI[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_unsigned_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
       ::begin(in_stack_ffffffffffffff98);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_unsigned_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
       ::end(in_stack_ffffffffffffff98);
  while (bVar1 = std::operator!=(&local_28,&local_30), bVar1) {
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_int>_>::operator*
              ((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_int>_> *)0x2fa01a);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (in_RSI,(value_type_conflict *)__x);
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_int>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_int>_> *)in_RDI);
  }
  return __x;
}

Assistant:

std::vector<JointPolicy::joint_vertex_t> JointPolicy::joint_vertices() const {
  std::vector<joint_vertex_t> v;
  for (const auto& mit : stepmap) {
    v.push_back(mit.first);
  }
  return v;
}